

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::pprint::Indent_abi_cxx11_(string *__return_storage_ptr__,pprint *this,uint32_t n)

{
  uint uVar1;
  ulong uVar2;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  uVar2 = (ulong)this & 0xffffffff;
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  if ((int)this != 0) {
    do {
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_190,sIndentString_abi_cxx11_,DAT_0045e3a0);
      uVar1 = (int)uVar2 - 1;
      uVar2 = (ulong)uVar1;
    } while (uVar1 != 0);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  ::std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string Indent(uint32_t n) {
  std::stringstream ss;

  for (uint32_t i = 0; i < n; i++) {
    ss << sIndentString;
  }

  return ss.str();
}